

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.cpp
# Opt level: O2

int __thiscall de::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  SocketError *this_00;
  deBool dVar1;
  undefined4 in_register_00000034;
  allocator<char> local_39;
  string local_38;
  
  dVar1 = deSocket_connect(this->m_socket,*(deSocketAddress **)CONCAT44(in_register_00000034,__fd));
  if (dVar1 != 0) {
    return dVar1;
  }
  this_00 = (SocketError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Connecting socket failed",&local_39);
  SocketError::SocketError(this_00,&local_38);
  __cxa_throw(this_00,&SocketError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Socket::connect (const SocketAddress& address)
{
	if (!deSocket_connect(m_socket, address))
		throw SocketError("Connecting socket failed");
}